

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O0

int wipe_CalcBurn(BYTE *burnarray,int width,int height,int density)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  uint local_5c;
  uint c1;
  uint bottom;
  uint top;
  BYTE *p;
  BYTE *pixel;
  uint v;
  uint offs;
  BYTE *from;
  int local_28;
  int b;
  int a;
  int density_local;
  int height_local;
  int width_local;
  BYTE *burnarray_local;
  
  iVar5 = wipe_CalcBurn::voop;
  iVar7 = width * height;
  wipe_CalcBurn::voop = density / 3 + wipe_CalcBurn::voop;
  for (local_28 = 0; local_28 < density / 8; local_28 = local_28 + 1) {
    uVar2 = local_28 + iVar5 & width - 1U;
    uVar3 = FRandom::operator()(&M_Random);
    bVar1 = burnarray[(ulong)uVar2 + (long)iVar7];
    uVar4 = FRandom::operator()(&M_Random);
    uVar3 = MIN<unsigned_int>(bVar1 + 4 + (uVar3 & 0xf) + (uVar3 >> 3) + (uVar4 & 0x1f),0xff);
    burnarray[(ulong)(width * 2 + (uVar2 + (width * 3) / 2 & width - 1U)) + (long)iVar7] =
         (BYTE)uVar3;
    burnarray[(ulong)uVar2 + (long)iVar7] = (BYTE)uVar3;
  }
  iVar5 = MIN<int>(density + 10,width * 7);
  _v = burnarray;
  for (from._4_4_ = 0; from._4_4_ <= height; from._4_4_ = from._4_4_ + 2) {
    pbVar6 = _v + (width << 1);
    bVar1 = _v[width << 2];
    local_5c = (uint)*pbVar6 + (uint)pbVar6[(long)width + -1] + (uint)pbVar6[1] + (uint)bVar1 >> 2;
    if (1 < local_5c) {
      local_5c = local_5c - 1;
    }
    *_v = (BYTE)local_5c;
    _v[width] = (BYTE)(local_5c + bVar1 >> 1);
    p = _v;
    for (local_28 = 1; p = p + 1, local_28 < width + -1; local_28 = local_28 + 1) {
      pbVar6 = p + (width << 1);
      bVar1 = p[width << 2];
      local_5c = (uint)*pbVar6 + (uint)pbVar6[-1] + (uint)pbVar6[1] + (uint)bVar1 >> 2;
      if (1 < local_5c) {
        local_5c = local_5c - 1;
      }
      *p = (BYTE)local_5c;
      p[width] = (BYTE)(local_5c + bVar1 >> 1);
    }
    pbVar6 = p + (width << 1);
    bVar1 = p[width << 2];
    local_5c = (uint)*pbVar6 + (uint)pbVar6[-1] + (uint)pbVar6[1 - (long)width] + (uint)bVar1 >> 2;
    if (1 < local_5c) {
      local_5c = local_5c - 1;
    }
    *p = (BYTE)local_5c;
    p[width] = (BYTE)(local_5c + bVar1 >> 1);
    _v = _v + (width << 1);
  }
  local_28 = width * height;
  _v = burnarray;
  while( true ) {
    if (local_28 == 0) {
      return -1;
    }
    if (*_v < 0x7e) break;
    local_28 = local_28 + -1;
    _v = _v + 1;
  }
  return iVar5;
}

Assistant:

int wipe_CalcBurn (BYTE *burnarray, int width, int height, int density)
{
	// This is a modified version of the fire that was once used
	// on the player setup menu.
	static int voop;

	int a, b;
	BYTE *from;

	// generator
	from = &burnarray[width * height];
	b = voop;
	voop += density / 3;
	for (a = 0; a < density/8; a++)
	{
		unsigned int offs = (a+b) & (width - 1);
		unsigned int v = M_Random();
		v = MIN(from[offs] + 4 + (v & 15) + (v >> 3) + (M_Random() & 31), 255u);
		from[offs] = from[width*2 + ((offs + width*3/2) & (width - 1))] = v;
	}

	density = MIN(density + 10, width * 7);

	from = burnarray;
	for (b = 0; b <= height; b += 2)
	{
		BYTE *pixel = from;

		// special case: first pixel on line
		BYTE *p = pixel + (width << 1);
		unsigned int top = *p + *(p + width - 1) + *(p + 1);
		unsigned int bottom = *(pixel + (width << 2));
		unsigned int c1 = (top + bottom) >> 2;
		if (c1 > 1) c1--;
		*pixel = c1;
		*(pixel + width) = (c1 + bottom) >> 1;
		pixel++;

		// main line loop
		for (a = 1; a < width-1; a++)
		{
			// sum top pixels
			p = pixel + (width << 1);
			top = *p + *(p - 1) + *(p + 1);

			// bottom pixel
			bottom = *(pixel + (width << 2));

			// combine pixels
			c1 = (top + bottom) >> 2;
			if (c1 > 1) c1--;

			// store pixels
			*pixel = c1;
			*(pixel + width) = (c1 + bottom) >> 1;		// interpolate

			// next pixel
			pixel++;
		}

		// special case: last pixel on line
		p = pixel + (width << 1);
		top = *p + *(p - 1) + *(p - width + 1);
		bottom = *(pixel + (width << 2));
		c1 = (top + bottom) >> 2;
		if (c1 > 1) c1--;
		*pixel = c1;
		*(pixel + width) = (c1 + bottom) >> 1;

		// next line
		from += width << 1;
	}

	// Check for done-ness. (Every pixel with level 126 or higher counts as done.)
	for (a = width * height, from = burnarray; a != 0; --a, ++from)
	{
		if (*from < 126)
		{
			return density;
		}
	}
	return -1;
}